

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

FilterResult __thiscall
duckdb::FilterCombiner::AddTransitiveFilters
          (FilterCombiner *this,BoundComparisonExpression *comparison,bool is_root)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  ExpressionType EVar1;
  LogicalTypeId LVar2;
  LogicalTypeId type;
  _Base_ptr p_Var3;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var4;
  LogicalTypeId LVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  FilterResult FVar9;
  type pEVar10;
  Expression *expr;
  Expression *expr_00;
  BoundCastExpression *pBVar11;
  pointer pEVar12;
  BoundColumnRefExpression *pBVar13;
  BoundCastExpression *pBVar14;
  BoundColumnRefExpression *pBVar15;
  idx_t iVar16;
  idx_t iVar17;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var18;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined4 extraout_var;
  BoundComparisonExpression *comparison_00;
  _Base_ptr p_Var20;
  undefined7 in_register_00000011;
  pointer *__ptr;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  FilterCombiner *pFVar23;
  Value *pVVar24;
  _Hash_node_base *p_Var25;
  char cVar26;
  ExpressionValueInformation info;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_138;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_130;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_128;
  FilterCombiner *local_120;
  LogicalType local_118;
  ulong local_100;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_f8;
  _Base_ptr local_f0;
  Value *local_e8;
  undefined4 local_dc;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *local_d8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_d0;
  BoundComparisonExpression *local_c8;
  undefined1 local_c0 [72];
  LogicalTypeId local_38;
  undefined8 uVar19;
  
  local_dc = (undefined4)CONCAT71(in_register_00000011,is_root);
  EVar1 = (comparison->super_Expression).super_BaseExpression.type;
  if ((((EVar1 & 0xfd) == COMPARE_GREATERTHAN) || (EVar1 == COMPARE_LESSTHANOREQUALTO)) ||
     (FVar9 = UNSUPPORTED, EVar1 == COMPARE_LESSTHAN)) {
    local_f8 = &comparison->left;
    local_c8 = comparison;
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(local_f8);
    expr = GetNode(this,pEVar10);
    local_d0 = &comparison->right;
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(local_d0);
    expr_00 = GetNode(this,pEVar10);
    if ((expr_00->super_BaseExpression).type == OPERATOR_CAST) {
      pBVar11 = BaseExpression::Cast<duckdb::BoundCastExpression>(&expr_00->super_BaseExpression);
      this_00 = &pBVar11->child;
      pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_00);
      if ((pEVar12->super_BaseExpression).type == BOUND_COLUMN_REF) {
        pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_00);
        pBVar13 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                            (&pEVar12->super_BaseExpression);
        p_Var25 = (this->stored_expressions)._M_h._M_before_begin._M_nxt;
        local_120 = this;
        if (p_Var25 != (_Hash_node_base *)0x0) {
          local_e8 = (Value *)this_00;
          do {
            pEVar10 = (type)p_Var25[1]._M_nxt;
            if ((pEVar10->super_BaseExpression).type == OPERATOR_CAST) {
              pBVar14 = BaseExpression::Cast<duckdb::BoundCastExpression>
                                  (&expr_00->super_BaseExpression);
              pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator*(&pBVar14->child);
            }
            if ((((pEVar10->super_BaseExpression).type == BOUND_COLUMN_REF) &&
                (pBVar15 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                     (&pEVar10->super_BaseExpression),
                (pBVar15->binding).table_index == (pBVar13->binding).table_index)) &&
               ((pBVar15->binding).column_index == (pBVar13->binding).column_index)) {
              pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)(p_Var25 + 2));
              bVar6 = LogicalType::operator==
                                (&(pBVar11->super_Expression).return_type,&pEVar12->return_type);
              if (bVar6) {
                pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                        *)(p_Var25 + 2));
                (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(local_c0,pEVar12);
                uVar19 = local_c0._0_8_;
                pVVar24 = local_e8;
                this = local_120;
                local_c0._0_8_ =
                     (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
                _Var4._M_head_impl =
                     (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                      &local_e8->type_)->_M_t).
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                 &local_e8->type_)->_M_t).
                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                     (Expression *)uVar19;
                if (_Var4._M_head_impl != (Expression *)0x0) {
                  (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
                }
                if ((ClientContext *)local_c0._0_8_ != (ClientContext *)0x0) {
                  (*((BaseExpression *)local_c0._0_8_)->_vptr_BaseExpression[1])();
                }
                pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                       *)pVVar24);
                expr_00 = GetNode(this,pEVar10);
                break;
              }
            }
            p_Var25 = p_Var25->_M_nxt;
            this = local_120;
          } while (p_Var25 != (_Hash_node_base *)0x0);
        }
      }
    }
    iVar7 = (*(expr->super_BaseExpression)._vptr_BaseExpression[10])(expr,expr_00);
    FVar9 = UNSUPPORTED;
    if ((char)iVar7 == '\0') {
      iVar16 = GetEquivalenceSet(this,expr);
      iVar17 = GetEquivalenceSet(this,expr_00);
      FVar9 = SUCCESS;
      if (iVar16 != iVar17) {
        p_Var20 = &(this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var3 = (this->constant_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var21 = p_Var20;
        for (p_Var22 = p_Var3; p_Var22 != (_Base_ptr)0x0;
            p_Var22 = (&p_Var22->_M_left)[*(ulong *)(p_Var22 + 1) < iVar16]) {
          if (*(ulong *)(p_Var22 + 1) >= iVar16) {
            p_Var21 = p_Var22;
          }
        }
        p_Var22 = p_Var20;
        local_f0 = p_Var20;
        if ((p_Var21 != p_Var20) && (local_f0 = p_Var21, iVar16 < *(ulong *)(p_Var21 + 1))) {
          local_f0 = p_Var20;
        }
        for (; p_Var3 != (_Base_ptr)0x0;
            p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < iVar17]) {
          if (*(ulong *)(p_Var3 + 1) >= iVar17) {
            p_Var22 = p_Var3;
          }
        }
        if ((p_Var22 != p_Var20) && (*(ulong *)(p_Var22 + 1) <= iVar17)) {
          p_Var20 = p_Var22;
        }
        pVVar24 = (Value *)p_Var20[1]._M_parent;
        local_e8 = (Value *)p_Var20[1]._M_left;
        bVar6 = pVVar24 == local_e8;
        local_120 = this;
        if (bVar6) {
          iVar7 = 0;
        }
        else {
          local_f0 = (_Base_ptr)&((_Base_ptr)((long)local_f0 + 0x20))->_M_parent;
          local_d8 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&this->remaining_filters;
          iVar7 = 0;
          local_100 = 0;
          do {
            LogicalType::LogicalType(&local_118,SQLNULL);
            Value::Value((Value *)local_c0,&local_118);
            LogicalType::~LogicalType(&local_118);
            Value::operator=((Value *)local_c0,pVVar24);
            LVar2 = pVVar24[1].type_.id_;
            type = (local_c8->super_Expression).super_BaseExpression.type;
            LVar5 = type;
            if (LVar2 == VARCHAR) {
LAB_00d5ddbe:
              local_c0[0x40] = LVar5;
              pFVar23 = (FilterCombiner *)&stack0xffffffffffffff88;
              Value::Value((Value *)pFVar23,(Value *)local_c0);
              local_38 = local_c0[0x40];
              FVar9 = AddConstantComparison
                                (pFVar23,(vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>
                                          *)local_f0,
                                 (ExpressionValueInformation *)&stack0xffffffffffffff88);
              Value::~Value((Value *)&stack0xffffffffffffff88);
              cVar26 = FVar9 == UNSATISFIABLE;
              if (!(bool)cVar26) {
                iVar7 = 1;
              }
            }
            else {
              if (type == UINTEGER && (LVar2 & ~UNKNOWN) == UTINYINT) {
LAB_00d5db81:
                LVar5 = LVar2;
                if ((local_100 & 1) == 0) {
                  local_c0[0x40] = LVar2;
                  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->(local_f8);
                  (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_130,pEVar12);
                  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            ::operator->(local_d0);
                  (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_138,pEVar12);
                  _Var18.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                       (_Head_base<0UL,_duckdb::Expression_*,_false>)operator_new(0x68);
                  local_118._0_8_ = local_130._M_head_impl;
                  local_130._M_head_impl = (Expression *)0x0;
                  local_128._M_head_impl = local_138._M_head_impl;
                  local_138._M_head_impl = (Expression *)0x0;
                  BoundComparisonExpression::BoundComparisonExpression
                            ((BoundComparisonExpression *)
                             _Var18.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,
                             type,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                   *)&local_118,
                             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)&local_128);
                  if (local_128._M_head_impl != (Expression *)0x0) {
                    (*((local_128._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  local_128._M_head_impl = (Expression *)0x0;
                  if ((Expression *)local_118._0_8_ != (Expression *)0x0) {
                    (**(code **)(*(long *)local_118._0_8_ + 8))();
                  }
                  if (local_138._M_head_impl != (Expression *)0x0) {
                    (*((local_138._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  if (local_130._M_head_impl != (Expression *)0x0) {
                    (*((local_130._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                  }
                  local_118._0_8_ =
                       _Var18.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                  ::std::
                  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  ::
                  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                            (local_d8,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                       *)&local_118);
                  uVar19 = extraout_RAX;
LAB_00d5dda7:
                  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                       )local_118._0_8_ != (Expression *)0x0) {
                    iVar8 = (**(code **)(*(long *)local_118._0_8_ + 8))();
                    uVar19 = CONCAT44(extraout_var,iVar8);
                  }
                  local_100 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
                  LVar5 = local_c0[0x40];
                }
                goto LAB_00d5ddbe;
              }
              cVar26 = '\a';
              if (type == INTERVAL) {
LAB_00d5dcb6:
                if ((LVar2 == USMALLINT) || (LVar2 == INTERVAL)) {
LAB_00d5dcc4:
                  if ((local_100 & 1) == 0) {
                    local_c0[0x40] = type;
                    pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              ::operator->(local_f8);
                    (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])
                              (&local_130,pEVar12);
                    pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              ::operator->(local_d0);
                    (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])
                              (&local_138,pEVar12);
                    _Var18.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                         (_Head_base<0UL,_duckdb::Expression_*,_false>)operator_new(0x68);
                    local_118._0_8_ = local_130._M_head_impl;
                    local_130._M_head_impl = (Expression *)0x0;
                    local_128._M_head_impl = local_138._M_head_impl;
                    local_138._M_head_impl = (Expression *)0x0;
                    BoundComparisonExpression::BoundComparisonExpression
                              ((BoundComparisonExpression *)
                               _Var18.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                               _M_head_impl,type,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_118,
                               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)&local_128);
                    if (local_128._M_head_impl != (Expression *)0x0) {
                      (*((local_128._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                    }
                    local_128._M_head_impl = (Expression *)0x0;
                    if ((Expression *)local_118._0_8_ != (Expression *)0x0) {
                      (**(code **)(*(long *)local_118._0_8_ + 8))();
                    }
                    if (local_138._M_head_impl != (Expression *)0x0) {
                      (*((local_138._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                    }
                    if (local_130._M_head_impl != (Expression *)0x0) {
                      (*((local_130._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
                    }
                    local_118._0_8_ =
                         _Var18.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
                    ::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    ::
                    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                              (local_d8,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                         *)&local_118);
                    uVar19 = extraout_RAX_00;
                    goto LAB_00d5dda7;
                  }
                  goto LAB_00d5ddbe;
                }
              }
              else {
                if (type == UTINYINT) {
                  if ((LVar2 & ~UNKNOWN) != UTINYINT) goto LAB_00d5dcae;
                  goto LAB_00d5dcc4;
                }
                if (type == USMALLINT) {
                  if ((LVar2 == USMALLINT) || (LVar2 == INTERVAL)) goto LAB_00d5db81;
LAB_00d5dcae:
                  if (type == INTERVAL) goto LAB_00d5dcb6;
                }
              }
            }
            Value::~Value((Value *)local_c0);
            if ((cVar26 != '\a') && (cVar26 != '\0')) break;
            pVVar24 = (Value *)&pVVar24[1].type_.type_info_;
            bVar6 = pVVar24 == local_e8;
          } while (!bVar6);
        }
        pFVar23 = local_120;
        FVar9 = UNSATISFIABLE;
        if (bVar6) {
          if ((byte)((byte)local_dc & (byte)iVar7) == 1) {
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (local_f8);
            FindTransitiveFilter((FilterCombiner *)local_c0,(Expression *)pFVar23);
            if ((ClientContext *)local_c0._0_8_ != (ClientContext *)0x0) {
              pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)local_c0);
              comparison_00 =
                   BaseExpression::Cast<duckdb::BoundComparisonExpression>
                             (&pEVar12->super_BaseExpression);
              FVar9 = AddTransitiveFilters(pFVar23,comparison_00,false);
              if (FVar9 == UNSATISFIABLE) {
                if ((ClientContext *)local_c0._0_8_ != (ClientContext *)0x0) {
                  (*((BaseExpression *)local_c0._0_8_)->_vptr_BaseExpression[1])();
                }
                return UNSATISFIABLE;
              }
              if (FVar9 == UNSUPPORTED) {
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&pFVar23->remaining_filters,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)local_c0);
              }
            }
            if ((Expression *)local_c0._0_8_ != (Expression *)0x0) {
              (**(code **)(*(long *)local_c0._0_8_ + 8))();
            }
            FVar9 = SUCCESS;
          }
          else {
            FVar9 = UNSUPPORTED - iVar7;
          }
        }
      }
    }
  }
  return FVar9;
}

Assistant:

FilterResult FilterCombiner::AddTransitiveFilters(BoundComparisonExpression &comparison, bool is_root) {
	if (!IsGreaterThan(comparison.GetExpressionType()) && !IsLessThan(comparison.GetExpressionType())) {
		return FilterResult::UNSUPPORTED;
	}
	// get the LHS and RHS nodes
	auto &left_node = GetNode(*comparison.left);
	reference<Expression> right_node = GetNode(*comparison.right);
	// In case with filters like CAST(i) = j and i = 5 we replace the COLUMN_REF i with the constant 5
	do {
		if (right_node.get().GetExpressionType() != ExpressionType::OPERATOR_CAST) {
			break;
		}
		auto &bound_cast_expr = right_node.get().Cast<BoundCastExpression>();
		if (bound_cast_expr.child->GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
			break;
		}
		auto &col_ref = bound_cast_expr.child->Cast<BoundColumnRefExpression>();
		for (auto &stored_exp : stored_expressions) {
			reference<Expression> expr = stored_exp.first;
			if (expr.get().GetExpressionType() == ExpressionType::OPERATOR_CAST) {
				expr = *(right_node.get().Cast<BoundCastExpression>().child);
			}
			if (expr.get().GetExpressionType() != ExpressionType::BOUND_COLUMN_REF) {
				continue;
			}
			auto &st_col_ref = expr.get().Cast<BoundColumnRefExpression>();
			if (st_col_ref.binding != col_ref.binding) {
				continue;
			}
			if (bound_cast_expr.return_type != stored_exp.second->return_type) {
				continue;
			}
			bound_cast_expr.child = stored_exp.second->Copy();
			right_node = GetNode(*bound_cast_expr.child);
			break;
		}
	} while (false);

	if (left_node.Equals(right_node)) {
		return FilterResult::UNSUPPORTED;
	}
	// get the equivalence sets of the LHS and RHS
	idx_t left_equivalence_set = GetEquivalenceSet(left_node);
	idx_t right_equivalence_set = GetEquivalenceSet(right_node);
	if (left_equivalence_set == right_equivalence_set) {
		// this equality filter already exists, prune it
		return FilterResult::SUCCESS;
	}

	vector<ExpressionValueInformation> &left_constants = constant_values.find(left_equivalence_set)->second;
	vector<ExpressionValueInformation> &right_constants = constant_values.find(right_equivalence_set)->second;
	bool is_successful = false;
	bool is_inserted = false;
	// read every constant filters already inserted for the right scalar variable
	// and see if we can create new transitive filters, e.g., there is already a filter i > 10,
	// suppose that we have now the j >= i, then we can infer a new filter j > 10
	for (const auto &right_constant : right_constants) {
		ExpressionValueInformation info;
		info.constant = right_constant.constant;
		// there is already an equality filter, e.g., i = 10
		if (right_constant.comparison_type == ExpressionType::COMPARE_EQUAL) {
			// create filter j [>, >=, <, <=] 10
			// suppose the new comparison is j >= i and we have already a filter i = 10,
			// then we create a new filter j >= 10
			// and the filter j >= i can be pruned by not adding it into the remaining filters
			info.comparison_type = comparison.GetExpressionType();
		} else if ((comparison.GetExpressionType() == ExpressionType::COMPARE_GREATERTHANOREQUALTO &&
		            IsGreaterThan(right_constant.comparison_type)) ||
		           (comparison.GetExpressionType() == ExpressionType::COMPARE_LESSTHANOREQUALTO &&
		            IsLessThan(right_constant.comparison_type))) {
			// filters (j >= i AND i [>, >=] 10) OR (j <= i AND i [<, <=] 10)
			// create filter j [>, >=] 10 and add the filter j [>=, <=] i into the remaining filters
			info.comparison_type = right_constant.comparison_type; // create filter j [>, >=, <, <=] 10
			if (!is_inserted) {
				// Add the filter j >= i in the remaing filters
				auto filter = make_uniq<BoundComparisonExpression>(comparison.GetExpressionType(),
				                                                   comparison.left->Copy(), comparison.right->Copy());
				remaining_filters.push_back(std::move(filter));
				is_inserted = true;
			}
		} else if ((comparison.GetExpressionType() == ExpressionType::COMPARE_GREATERTHAN &&
		            IsGreaterThan(right_constant.comparison_type)) ||
		           (comparison.GetExpressionType() == ExpressionType::COMPARE_LESSTHAN &&
		            IsLessThan(right_constant.comparison_type))) {
			// filters (j > i AND i [>, >=] 10) OR j < i AND i [<, <=] 10
			// create filter j [>, <] 10 and add the filter j [>, <] i into the remaining filters
			// the comparisons j > i and j < i are more restrictive
			info.comparison_type = comparison.GetExpressionType();
			if (!is_inserted) {
				// Add the filter j [>, <] i
				auto filter = make_uniq<BoundComparisonExpression>(comparison.GetExpressionType(),
				                                                   comparison.left->Copy(), comparison.right->Copy());
				remaining_filters.push_back(std::move(filter));
				is_inserted = true;
			}
		} else {
			// we cannot add a new filter
			continue;
		}
		// Add the new filer into the left set
		if (AddConstantComparison(left_constants, info) == FilterResult::UNSATISFIABLE) {
			return FilterResult::UNSATISFIABLE;
		}
		is_successful = true;
	}
	if (is_successful) {
		if (is_root) {
			// now check for remaining transitive filters from the left column
			auto transitive_filter = FindTransitiveFilter(*comparison.left);
			if (transitive_filter != nullptr) {
				// try to add transitive filters
				auto &transitive_cast = transitive_filter->Cast<BoundComparisonExpression>();
				auto transitive_result = AddTransitiveFilters(transitive_cast, false);
				if (transitive_result == FilterResult::UNSUPPORTED) {
					// in case of unsuccessful re-add filter into remaining ones
					remaining_filters.push_back(std::move(transitive_filter));
				}
				if (transitive_result == FilterResult::UNSATISFIABLE) {
					// while adding transitive filters we discovered the filter is unsatisfisable - we can prune
					return FilterResult::UNSATISFIABLE;
				}
			}
		}
		return FilterResult::SUCCESS;
	}

	return FilterResult::UNSUPPORTED;
}